

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall QueryPlan::printResultSet(QueryPlan *this)

{
  int iVar1;
  undefined4 extraout_var;
  BatchResult *this_00;
  
  while( true ) {
    iVar1 = (*this->head_->_vptr_BaseOperator[4])();
    this_00 = (BatchResult *)CONCAT44(extraout_var,iVar1);
    if (this_00 == (BatchResult *)0x0) break;
    BatchResult::~BatchResult(this_00);
    operator_delete(this_00,0x30);
  }
  return;
}

Assistant:

void printResultSet() {
        BatchResult *rs = nullptr;
        while (true) {
            rs = head_->next();
            if (rs == nullptr)
                break;

            // rs->print();
            delete rs;
        }
    }